

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::setLearningPolicy(FullyConnectedLayer *this,ALearningPolicy *lp)

{
  unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
  local_20;
  ALearningPolicy *local_18;
  ALearningPolicy *lp_local;
  FullyConnectedLayer *this_local;
  
  local_18 = lp;
  lp_local = (ALearningPolicy *)this;
  (*lp->_vptr_ALearningPolicy[1])();
  ::std::shared_ptr<notch::core::ALearningPolicy>::operator=(&this->policy,&local_20);
  std::unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

virtual void setLearningPolicy(const ALearningPolicy &lp) {
        policy = lp.clone();
    }